

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DList.h
# Opt level: O2

void __thiscall
DListBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>,_RealCount>::
RemoveElement<Memory::NoThrowHeapAllocator>
          (DListBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>,_RealCount> *this,
          NoThrowHeapAllocator *allocator,PageSegmentBase<Memory::VirtualAllocWrapper> *element)

{
  undefined4 *puVar1;
  DListNodeBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_> *pDVar2;
  code *pcVar3;
  bool bVar4;
  DListNode<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_> *obj;
  undefined8 *in_FS_OFFSET;
  
  obj = (DListNode<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_> *)
        (element[-1].decommitPages.data + 4);
  bVar4 = HasNode(this,(NodeBase *)obj);
  if (!bVar4) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar1 = (undefined4 *)*in_FS_OFFSET;
    *puVar1 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/DList.h"
                       ,0x175,"(HasNode(node))","HasNode(node)");
    if (!bVar4) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar1 = 0;
  }
  pDVar2 = (obj->super_DListNodeBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>).next.
           base;
  **(long **)&element[-1].freePageCount = (long)pDVar2;
  pDVar2->prev = *(anon_union_8_3_7fb8a913_for_prev *)&element[-1].freePageCount;
  Memory::
  DeleteObject<Memory::NoThrowHeapAllocator,(Memory::AllocatorDeleteFlags)0,DListNode<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>>>
            (allocator,obj);
  (this->super_RealCount).count = (this->super_RealCount).count - 1;
  return;
}

Assistant:

void RemoveElement(TAllocator * allocator, TData * element)
    {
        Node * node = CONTAINING_RECORD(element, Node, data);
#if DBG_DUMP
        Assert(HasNode(node));
#endif
        DListBase::RemoveNode(node);
        AllocatorDelete(TAllocator, allocator, node);

        this->DecrementCount();

    }